

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

void get_range<double>(size_t *ix_arr,double *x,size_t st,size_t end,MissingAction missing_action,
                      double *xmin,double *xmax,bool *unsplittable)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  int iVar4;
  ulong in_RCX;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  double *in_R9;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  double *in_stack_00000008;
  byte *in_stack_00000010;
  size_t row_1;
  size_t row;
  double xval;
  byte local_59;
  double local_58;
  double local_50;
  ulong local_48;
  ulong local_40;
  
  *in_R9 = INFINITY;
  *in_stack_00000008 = -INFINITY;
  local_48 = in_RDX;
  local_40 = in_RDX;
  if (in_R8D == 0) {
    for (; local_40 <= in_RCX; local_40 = local_40 + 1) {
      local_58 = *(double *)(in_RSI + *(long *)(in_RDI + local_40 * 8) * 8);
      local_50 = local_58;
      if (*in_R9 <= local_58) {
        local_50 = *in_R9;
      }
      *in_R9 = local_50;
      if (local_58 < *in_stack_00000008 || local_58 == *in_stack_00000008) {
        local_58 = *in_stack_00000008;
      }
      *in_stack_00000008 = local_58;
    }
  }
  else {
    for (; local_48 <= in_RCX; local_48 = local_48 + 1) {
      dVar1 = *(double *)(in_RSI + *(long *)(in_RDI + local_48 * 8) * 8);
      dVar2 = *in_R9;
      uVar6 = (undefined4)((ulong)dVar1 >> 0x20);
      uVar5 = SUB84(dVar1,0);
      uVar7 = uVar6;
      if (dVar2 <= dVar1) {
        uVar5 = SUB84(dVar2,0);
        uVar7 = (int)((ulong)dVar2 >> 0x20);
      }
      *in_R9 = (double)(~-(ulong)NAN(dVar2) & CONCAT44(uVar7,uVar5) |
                       -(ulong)NAN(dVar2) & (ulong)dVar1);
      dVar2 = *in_stack_00000008;
      uVar5 = SUB84(dVar1,0);
      if (dVar1 <= dVar2) {
        uVar5 = SUB84(dVar2,0);
        uVar6 = (int)((ulong)dVar2 >> 0x20);
      }
      *in_stack_00000008 =
           (double)(~-(ulong)NAN(dVar2) & CONCAT44(uVar6,uVar5) | -(ulong)NAN(dVar2) & (ulong)dVar1)
      ;
    }
  }
  local_59 = 1;
  if ((*in_R9 != *in_stack_00000008) || (NAN(*in_R9) || NAN(*in_stack_00000008))) {
    if ((*in_R9 == INFINITY) && (!NAN(*in_R9))) {
      local_59 = 1;
      if ((*in_stack_00000008 == -INFINITY) && (!NAN(*in_stack_00000008))) goto LAB_0021daf5;
    }
    uVar3 = std::isnan(*in_R9);
    local_59 = 1;
    if ((uVar3 & 1) == 0) {
      iVar4 = std::isnan(*in_stack_00000008);
      local_59 = (byte)iVar4;
    }
  }
LAB_0021daf5:
  *in_stack_00000010 = local_59 & 1;
  return;
}

Assistant:

void get_range(size_t ix_arr[], real_t *restrict x, size_t st, size_t end,
               MissingAction missing_action, double &restrict xmin, double &restrict xmax, bool &unsplittable) noexcept
{
    xmin =  HUGE_VAL;
    xmax = -HUGE_VAL;
    double xval;

    if (missing_action == Fail)
    {
        for (size_t row = st; row <= end; row++)
        {
            xval = x[ix_arr[row]];
            xmin = (xval < xmin)? xval : xmin;
            xmax = (xval > xmax)? xval : xmax;
        }
    }


    else
    {
        for (size_t row = st; row <= end; row++)
        {
            xval = x[ix_arr[row]];
            xmin = std::fmin(xmin, xval);
            xmax = std::fmax(xmax, xval);
        }
    }

    unsplittable = (xmin == xmax) || (xmin == HUGE_VAL && xmax == -HUGE_VAL) || std::isnan(xmin) || std::isnan(xmax);
}